

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O3

uint8 * google::protobuf::internal::WireFormatLite::WriteSInt32ToArray
                  (int field_number,int32 value,uint8 *target)

{
  bool bVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = field_number << 3;
  uVar3 = uVar4;
  if (0x7f < uVar4) {
    do {
      *target = (byte)uVar4 | 0x80;
      uVar3 = uVar4 >> 7;
      target = target + 1;
      bVar1 = 0x3fff < uVar4;
      uVar4 = uVar3;
    } while (bVar1);
  }
  *target = (byte)uVar3;
  pbVar2 = target + 1;
  uVar4 = value >> 0x1f ^ value * 2;
  uVar3 = uVar4;
  if (0x7f < uVar4) {
    do {
      *pbVar2 = (byte)uVar4 | 0x80;
      uVar3 = uVar4 >> 7;
      pbVar2 = pbVar2 + 1;
      bVar1 = 0x3fff < uVar4;
      uVar4 = uVar3;
    } while (bVar1);
  }
  *pbVar2 = (byte)uVar3;
  return pbVar2 + 1;
}

Assistant:

inline uint8* WireFormatLite::WriteSInt32ToArray(int field_number,
                                                 int32 value,
                                                 uint8* target) {
  target = WriteTagToArray(field_number, WIRETYPE_VARINT, target);
  return WriteSInt32NoTagToArray(value, target);
}